

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<TCBPoint>::reallocateAndGrow
          (QArrayDataPointer<TCBPoint> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<TCBPoint> *old)

{
  long lVar1;
  bool bVar2;
  TCBPoint *pTVar3;
  QPodArrayOps<TCBPoint> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<TCBPoint> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<TCBPoint> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  TCBPoint *in_stack_ffffffffffffff70;
  TCBPoint *in_stack_ffffffffffffff78;
  QArrayDataPointer<TCBPoint> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<TCBPoint> *)in_stack_ffffffffffffff70), bVar2)) ||
     (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<TCBPoint> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pTVar3 = data((QArrayDataPointer<TCBPoint> *)&stack0xffffffffffffffe0),
       pTVar3 == (TCBPoint *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_0071c2ae;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<TCBPoint> *)in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<TCBPoint> *)
                  operator->((QArrayDataPointer<TCBPoint> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<TCBPoint> *)0x71c1c7);
        begin((QArrayDataPointer<TCBPoint> *)0x71c1d6);
        QtPrivate::QPodArrayOps<TCBPoint>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (TCBPoint *)operator->((QArrayDataPointer<TCBPoint> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<TCBPoint> *)0x71c20c);
        begin((QArrayDataPointer<TCBPoint> *)0x71c21b);
        QtPrivate::QPodArrayOps<TCBPoint>::moveAppend
                  ((QPodArrayOps<TCBPoint> *)in_stack_ffffffffffffff70,
                   (TCBPoint *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (TCBPoint *)0x71c236);
      }
    }
    swap((QArrayDataPointer<TCBPoint> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<TCBPoint> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<TCBPoint> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<TCBPoint> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<TCBPoint> *)in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<TCBPoint> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<TCBPoint> *)in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<TCBPoint>::reallocate
              ((QPodArrayOps<TCBPoint> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0071c2ae:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }